

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTtfTable>::emplace<QTtfTable>
          (QMovableArrayOps<QTtfTable> *this,qsizetype i,QTtfTable *args)

{
  QTtfTable **ppQVar1;
  QTtfTable *pQVar2;
  Tag TVar3;
  Data *pDVar4;
  QTtfTable *pQVar5;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  qsizetype *pqVar9;
  bool bVar10;
  
  pDVar4 = (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if (((this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr,
       (pDVar4->super_QArrayData).alloc !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      pQVar5[i].tag = args->tag;
      pDVar6 = (args->data).d.d;
      (args->data).d.d = (Data *)0x0;
      pQVar5[i].data.d.d = pDVar6;
      pcVar7 = (args->data).d.ptr;
      (args->data).d.ptr = (char *)0x0;
      pQVar5[i].data.d.ptr = pcVar7;
      qVar8 = (args->data).d.size;
      (args->data).d.size = 0;
      pQVar5[i].data.d.size = qVar8;
      goto LAB_004b1131;
    }
    if ((i == 0) &&
       (pQVar5 = (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr,
       (QTtfTable *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       pQVar5)) {
      pQVar5[-1].tag = args->tag;
      pDVar6 = (args->data).d.d;
      (args->data).d.d = (Data *)0x0;
      pQVar5[-1].data.d.d = pDVar6;
      pcVar7 = (args->data).d.ptr;
      (args->data).d.ptr = (char *)0x0;
      pQVar5[-1].data.d.ptr = pcVar7;
      qVar8 = (args->data).d.size;
      (args->data).d.size = 0;
      pQVar5[-1].data.d.size = qVar8;
      ppQVar1 = &(this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_004b1131;
    }
  }
  TVar3 = args->tag;
  pDVar6 = (args->data).d.d;
  (args->data).d.d = (Data *)0x0;
  pcVar7 = (args->data).d.ptr;
  qVar8 = (args->data).d.size;
  (args->data).d.ptr = (char *)0x0;
  (args->data).d.size = 0;
  bVar10 = (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size != 0;
  QArrayDataPointer<QTtfTable>::detachAndGrow
            ((QArrayDataPointer<QTtfTable> *)this,(uint)(i == 0 && bVar10),1,(QTtfTable **)0x0,
             (QArrayDataPointer<QTtfTable> *)0x0);
  pQVar5 = (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr;
  if (i == 0 && bVar10) {
    pQVar5[-1].tag = TVar3;
    pQVar5[-1].data.d.d = pDVar6;
    pQVar5[-1].data.d.ptr = pcVar7;
    pQVar5[-1].data.d.size = qVar8;
    (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr = pQVar5 + -1;
  }
  else {
    pQVar2 = pQVar5 + i;
    memmove(pQVar2 + 1,pQVar5 + i,
            ((this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size - i)
            * 0x20);
    pQVar2->tag = TVar3;
    (pQVar2->data).d.d = pDVar6;
    (pQVar2->data).d.ptr = pcVar7;
    (pQVar2->data).d.size = qVar8;
  }
LAB_004b1131:
  pqVar9 = &(this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size;
  *pqVar9 = *pqVar9 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }